

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5StructurePromote(Fts5Index *p,int iLvl,Fts5Structure *pStruct)

{
  int *piVar1;
  Fts5StructureSegment *pFVar2;
  Fts5StructureSegment *pFVar3;
  undefined8 uVar4;
  Fts5StructureSegment **ppFVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  Fts5StructureSegment **ppFVar10;
  long lVar11;
  long in_R8;
  int iVar12;
  long local_50;
  
  if (p->rc != 0) {
    return;
  }
  lVar8 = (long)pStruct->aLevel[iLvl].nSeg;
  if (lVar8 != 0) {
    pFVar2 = pStruct->aLevel[iLvl].aSeg;
    iVar6 = (pFVar2[lVar8 + -1].pgnoLast - pFVar2[lVar8 + -1].pgnoFirst) + 1;
    ppFVar5 = &pStruct->aLevel[(uint)iLvl].aSeg;
    iVar7 = iLvl;
    do {
      ppFVar10 = ppFVar5;
      if (iVar7 < 1) {
        iVar7 = -1;
        iVar9 = 0;
        goto LAB_001c0d7b;
      }
      iVar7 = iVar7 + -1;
      ppFVar5 = ppFVar10 + -2;
    } while (*(int *)((long)ppFVar10 + -0x14) == 0);
    in_R8 = (long)*(int *)((long)ppFVar10 + -0x14);
    iVar9 = 0;
    if (0 < in_R8) {
      pFVar2 = ppFVar10[-2];
      lVar8 = in_R8 * 0xc;
      in_R8 = 0;
      iVar9 = 0;
      do {
        iVar12 = *(int *)((long)&pFVar2->pgnoLast + in_R8) -
                 *(int *)((long)&pFVar2->pgnoFirst + in_R8);
        if (iVar9 <= iVar12) {
          iVar9 = iVar12 + 1;
        }
        in_R8 = in_R8 + 0xc;
      } while (lVar8 != in_R8);
    }
    if (iVar9 < iVar6) {
      iVar7 = -1;
      iVar9 = 0;
    }
LAB_001c0d7b:
    if (-1 < iVar7) {
      iLvl = iVar7;
      iVar6 = iVar9;
    }
    if ((pStruct->aLevel[iLvl].nMerge == 0) && (iLvl + 1 < pStruct->nLevel)) {
      local_50 = (long)(iLvl + 1);
      while (pStruct->aLevel[local_50].nMerge == 0) {
        lVar8 = (long)pStruct->aLevel[local_50].nSeg;
        if (0 < lVar8) {
          lVar11 = lVar8 + 1;
          lVar8 = lVar8 * 0xc;
          do {
            pFVar2 = pStruct->aLevel[local_50].aSeg;
            if (iVar6 < (*(int *)((long)pFVar2 + lVar8 + -4) - *(int *)((long)pFVar2 + lVar8 + -8))
                        + 1) {
              return;
            }
            fts5StructureExtendLevel(&p->rc,pStruct,iLvl,1,(int)in_R8);
            if (p->rc != 0) {
              return;
            }
            pFVar2 = pStruct->aLevel[iLvl].aSeg;
            pFVar3 = pStruct->aLevel[local_50].aSeg;
            pFVar2->pgnoLast = *(int *)(lVar8 + -4 + (long)pFVar3);
            uVar4 = *(undefined8 *)((long)&pFVar3[-1].iSegid + lVar8);
            pFVar2->iSegid = (int)uVar4;
            pFVar2->pgnoFirst = (int)((ulong)uVar4 >> 0x20);
            piVar1 = &pStruct->aLevel[iLvl].nSeg;
            *piVar1 = *piVar1 + 1;
            piVar1 = &pStruct->aLevel[local_50].nSeg;
            *piVar1 = *piVar1 + -1;
            lVar11 = lVar11 + -1;
            lVar8 = lVar8 + -0xc;
          } while (1 < lVar11);
        }
        local_50 = local_50 + 1;
        if (pStruct->nLevel <= local_50) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void fts5StructurePromote(
  Fts5Index *p,                   /* FTS5 backend object */
  int iLvl,                       /* Index level just updated */
  Fts5Structure *pStruct          /* Index structure */
){
  if( p->rc==SQLITE_OK ){
    int iTst;
    int iPromote = -1;
    int szPromote = 0;            /* Promote anything this size or smaller */
    Fts5StructureSegment *pSeg;   /* Segment just written */
    int szSeg;                    /* Size of segment just written */
    int nSeg = pStruct->aLevel[iLvl].nSeg;

    if( nSeg==0 ) return;
    pSeg = &pStruct->aLevel[iLvl].aSeg[pStruct->aLevel[iLvl].nSeg-1];
    szSeg = (1 + pSeg->pgnoLast - pSeg->pgnoFirst);

    /* Check for condition (a) */
    for(iTst=iLvl-1; iTst>=0 && pStruct->aLevel[iTst].nSeg==0; iTst--);
    if( iTst>=0 ){
      int i;
      int szMax = 0;
      Fts5StructureLevel *pTst = &pStruct->aLevel[iTst];
      assert( pTst->nMerge==0 );
      for(i=0; i<pTst->nSeg; i++){
        int sz = pTst->aSeg[i].pgnoLast - pTst->aSeg[i].pgnoFirst + 1;
        if( sz>szMax ) szMax = sz;
      }
      if( szMax>=szSeg ){
        /* Condition (a) is true. Promote the newest segment on level 
        ** iLvl to level iTst.  */
        iPromote = iTst;
        szPromote = szMax;
      }
    }

    /* If condition (a) is not met, assume (b) is true. StructurePromoteTo()
    ** is a no-op if it is not.  */
    if( iPromote<0 ){
      iPromote = iLvl;
      szPromote = szSeg;
    }
    fts5StructurePromoteTo(p, iPromote, szPromote, pStruct);
  }
}